

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O3

Status __thiscall leveldb::Env::NewAppendableFile(Env *this,string *fname,WritableFile **result)

{
  long in_FS_OFFSET;
  Slice local_30;
  Slice local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.data_ = "NewAppendableFile";
  local_20.size_ = 0x11;
  local_30.data_ = (char *)*result;
  local_30.size_ = (size_t)result[1];
  Status::Status((Status *)this,kNotSupported,&local_20,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Env::NewAppendableFile(const std::string& fname, WritableFile** result) {
  return Status::NotSupported("NewAppendableFile", fname);
}